

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

HighsStatus __thiscall HEkkPrimal::solve(HEkkPrimal *this,bool pass_force_phase2)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  HighsDebugStatus HVar5;
  HighsStatus HVar6;
  byte in_SIL;
  long *in_RDI;
  HighsStatus call_status;
  HEkkDual dual_solver;
  HighsInt simplex_strategy;
  double save_dual_simplex_cost_perturbation_multiplier;
  HighsStatus return_status;
  HighsInt it0;
  bool local_report;
  HighsInt num_primal_infeasibility;
  bool perturb_bounds;
  double unperturbed_sum_infeasibilities;
  double unperturbed_max_infeasibility;
  HighsInt unperturbed_num_infeasibilities;
  bool near_optimal;
  bool no_simplex_primal_infeasibilities;
  bool force_phase2;
  bool primal_feasible_with_unperturbed_bounds;
  HighsSimplexStatus *status;
  HighsSimplexInfo *info;
  HighsOptions *options;
  HighsLogOptions *in_stack_ffffffffffffd3a8;
  undefined4 in_stack_ffffffffffffd3b0;
  undefined4 in_stack_ffffffffffffd3b4;
  HighsInt in_stack_ffffffffffffd3b8;
  HighsInt in_stack_ffffffffffffd3bc;
  HighsSimplexAnalysis *in_stack_ffffffffffffd3c0;
  allocator *paVar7;
  size_type in_stack_ffffffffffffd3c8;
  undefined4 in_stack_ffffffffffffd3d0;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffd3d4;
  HighsInt in_stack_ffffffffffffd3f0;
  int iVar9;
  SimplexAlgorithm in_stack_ffffffffffffd3f4;
  HighsStatus in_stack_ffffffffffffd3f8;
  HighsStatus in_stack_ffffffffffffd3fc;
  undefined4 in_stack_ffffffffffffd400;
  HighsStatus in_stack_ffffffffffffd404;
  undefined7 in_stack_ffffffffffffd408;
  undefined1 in_stack_ffffffffffffd40f;
  HEkk *in_stack_ffffffffffffd410;
  HEkk *in_stack_ffffffffffffd420;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd448;
  undefined7 in_stack_ffffffffffffd450;
  undefined1 in_stack_ffffffffffffd457;
  HEkkPrimal *in_stack_ffffffffffffd458;
  undefined1 in_stack_ffffffffffffd46f;
  undefined7 in_stack_ffffffffffffd470;
  undefined1 in_stack_ffffffffffffd477;
  HighsInt in_stack_ffffffffffffd478;
  SimplexAlgorithm in_stack_ffffffffffffd47c;
  undefined7 in_stack_ffffffffffffd480;
  undefined1 in_stack_ffffffffffffd487;
  HighsInt in_stack_ffffffffffffd488;
  SimplexAlgorithm in_stack_ffffffffffffd48c;
  HEkk *in_stack_ffffffffffffd490;
  HEkk *in_stack_ffffffffffffd4b0;
  HEkk *in_stack_ffffffffffffd518;
  HEkkDual *in_stack_ffffffffffffd520;
  undefined1 in_stack_ffffffffffffdba7;
  HEkkDual *in_stack_ffffffffffffdba8;
  allocator local_51;
  string local_50 [32];
  long local_30;
  long local_28;
  long local_20;
  byte local_11;
  HighsStatus local_4;
  
  local_11 = in_SIL & 1;
  initialiseSolve((HEkkPrimal *)in_stack_ffffffffffffd3c0);
  bVar3 = HEkk::isUnconstrainedLp
                    ((HEkk *)CONCAT44(in_stack_ffffffffffffd3b4,in_stack_ffffffffffffd3b0));
  if (bVar3) {
    local_4 = HEkk::returnFromSolve
                        ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,in_stack_ffffffffffffd408),
                         in_stack_ffffffffffffd404);
  }
  else {
    local_20 = *(long *)(*in_RDI + 8);
    local_28 = *in_RDI + 0x2560;
    local_30 = *in_RDI + 0x2550;
    if ((*(byte *)(*in_RDI + 0x2558) & 1) == 0) {
      highsLogDev((HighsLogOptions *)(local_20 + 0x380),kError,
                  "HEkkPrimal::solve called without INVERT\n");
      local_4 = HEkk::returnFromSolve
                          ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,in_stack_ffffffffffffd408),
                           in_stack_ffffffffffffd404);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"Initialise",&local_51);
      HVar5 = debugPrimalSimplex((HEkkPrimal *)
                                 CONCAT44(in_stack_ffffffffffffd47c,in_stack_ffffffffffffd478),
                                 (string *)
                                 CONCAT17(in_stack_ffffffffffffd477,in_stack_ffffffffffffd470),
                                 (bool)in_stack_ffffffffffffd46f);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      if (HVar5 == kLogicalError) {
        local_4 = HEkk::returnFromSolve
                            ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,in_stack_ffffffffffffd408),
                             in_stack_ffffffffffffd404);
      }
      else {
        getNonbasicFreeColumnSet
                  ((HEkkPrimal *)CONCAT44(in_stack_ffffffffffffd3d4,in_stack_ffffffffffffd3d0));
        bVar3 = true;
        if ((local_11 & 1) == 0) {
          bVar3 = *(double *)(local_28 + 0x380) * *(double *)(local_28 + 0x380) <
                  *(double *)(local_20 + 0x118);
        }
        bVar4 = true;
        if (*(int *)(local_28 + 0x378) != 0) {
          bVar4 = bVar3;
        }
        bVar2 = false;
        if ((*(int *)(local_28 + 0x390) < 1000) &&
           (bVar2 = false,
           *(double *)(local_28 + 0x398) <= 0.001 && *(double *)(local_28 + 0x398) != 0.001)) {
          bVar2 = bVar4;
        }
        if (bVar2) {
          highsLogDev(*(HighsLogOptions **)(local_28 + 0x398),(HighsLogType)(local_20 + 0x380),
                      (char *)0x2,
                      "Primal feasible and num / max / sum dual infeasibilities of %d / %g / %g, so near-optimal\n"
                      ,(ulong)*(uint *)(local_28 + 0x390));
          highsLogDev((HighsLogOptions *)(local_20 + 0x380),kDetailed,
                      "Near-optimal, so don\'t use bound perturbation\n");
        }
        else if ((*(double *)(local_28 + 0x2c8) != 0.0) || (NAN(*(double *)(local_28 + 0x2c8)))) {
          HEkk::initialiseBound
                    (in_stack_ffffffffffffd490,in_stack_ffffffffffffd48c,in_stack_ffffffffffffd488,
                     (bool)in_stack_ffffffffffffd487);
          HEkk::initialiseNonbasicValueAndMove
                    ((HEkk *)CONCAT44(in_stack_ffffffffffffd3f4,in_stack_ffffffffffffd3f0));
          HEkk::computePrimal(in_stack_ffffffffffffd4b0);
          HEkk::computeSimplexPrimalInfeasible(in_stack_ffffffffffffd420);
        }
        bVar4 = HEkk::bailout(in_stack_ffffffffffffd410);
        if (bVar4) {
          local_4 = HEkk::returnFromSolve
                              ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,in_stack_ffffffffffffd408)
                               ,in_stack_ffffffffffffd404);
        }
        else {
          uVar8 = 2;
          if (0 < *(int *)(*in_RDI + 0x28d8)) {
            uVar8 = 1;
          }
          *(undefined4 *)((long)in_RDI + 0x1c) = uVar8;
          if (bVar3) {
            *(undefined4 *)((long)in_RDI + 0x1c) = 2;
          }
          HVar5 = HEkk::debugOkForSolve
                            ((HEkk *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8),
                             in_stack_ffffffffffffd3f4,in_stack_ffffffffffffd3f0);
          if (HVar5 == kLogicalError) {
            local_4 = HEkk::returnFromSolve
                                ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,
                                                  in_stack_ffffffffffffd408),
                                 in_stack_ffffffffffffd404);
          }
          else {
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_ffffffffffffd3d4,in_stack_ffffffffffffd3d0),
                       in_stack_ffffffffffffd3c8);
            localReportIter((HEkkPrimal *)in_stack_ffffffffffffd410,(bool)in_stack_ffffffffffffd40f)
            ;
            correctPrimal(in_stack_ffffffffffffd458,(bool)in_stack_ffffffffffffd457);
            while (*(int *)((long)in_RDI + 0x1c) != 0) {
              iVar9 = *(int *)(*in_RDI + 0x36f8);
              *(undefined1 *)(local_30 + 0xc) = 0;
              if (*(int *)((long)in_RDI + 0x1c) == -1) {
                HEkk::computeSimplexPrimalInfeasible(in_stack_ffffffffffffd420);
                uVar8 = 2;
                if (0 < *(int *)(*in_RDI + 0x28d8)) {
                  uVar8 = 1;
                }
                *(undefined4 *)((long)in_RDI + 0x1c) = uVar8;
                if ((*(byte *)(local_28 + 0x1b8) & 1) != 0) {
                  HEkk::initialiseCost
                            ((HEkk *)CONCAT17(in_stack_ffffffffffffd487,in_stack_ffffffffffffd480),
                             in_stack_ffffffffffffd47c,in_stack_ffffffffffffd478,
                             (bool)in_stack_ffffffffffffd477);
                  HEkk::initialiseNonbasicValueAndMove
                            ((HEkk *)CONCAT44(in_stack_ffffffffffffd3f4,in_stack_ffffffffffffd3f0));
                  *(undefined1 *)(local_28 + 0x1b8) = 0;
                }
              }
              if (*(int *)((long)in_RDI + 0x1c) == 1) {
                solvePhase1((HEkkPrimal *)in_stack_ffffffffffffd410);
                *(int *)(local_28 + 0x3b0) =
                     (*(int *)(*in_RDI + 0x36f8) - iVar9) + *(int *)(local_28 + 0x3b0);
              }
              else {
                if (*(int *)((long)in_RDI + 0x1c) != 2) {
                  *(undefined4 *)(*in_RDI + 0x2970) = 4;
                  HVar6 = HEkk::returnFromSolve
                                    ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,
                                                      in_stack_ffffffffffffd408),
                                     in_stack_ffffffffffffd404);
                  return HVar6;
                }
                solvePhase2((HEkkPrimal *)in_stack_ffffffffffffd420);
                *(int *)(local_28 + 0x3b4) =
                     (*(int *)(*in_RDI + 0x36f8) - iVar9) + *(int *)(local_28 + 0x3b4);
              }
              if ((*(byte *)(*in_RDI + 0x3708) & 1) != 0) {
                HVar6 = HEkk::returnFromSolve
                                  ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,
                                                    in_stack_ffffffffffffd408),
                                   in_stack_ffffffffffffd404);
                return HVar6;
              }
              if (*(int *)((long)in_RDI + 0x1c) == 5) {
                highsLogDev((HighsLogOptions *)(local_20 + 0x380),kInfo,
                            "HEkkPrimal::solve Only basis change is taboo\n");
                *(undefined4 *)(*in_RDI + 0x2970) = 0xf;
                HVar6 = HEkk::returnFromSolve
                                  ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,
                                                    in_stack_ffffffffffffd408),
                                   in_stack_ffffffffffffd404);
                return HVar6;
              }
              if (*(int *)((long)in_RDI + 0x1c) == -3) {
                *(undefined4 *)(*in_RDI + 0x2970) = 4;
                HVar6 = HEkk::returnFromSolve
                                  ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,
                                                    in_stack_ffffffffffffd408),
                                   in_stack_ffffffffffffd404);
                return HVar6;
              }
              if (*(int *)((long)in_RDI + 0x1c) == -2) {
                if (*(int *)(*in_RDI + 0x2970) == 8) {
                  std::vector<double,_std::allocator<double>_>::operator=
                            ((vector<double,_std::allocator<double>_> *)
                             CONCAT17(in_stack_ffffffffffffd457,in_stack_ffffffffffffd450),
                             in_stack_ffffffffffffd448);
                }
                break;
              }
              if (*(int *)((long)in_RDI + 0x1c) == 4) break;
            }
            if (*(int *)((long)in_RDI + 0x1c) == 0) {
              *(undefined4 *)(*in_RDI + 0x2970) = 7;
            }
            if (*(int *)((long)in_RDI + 0x1c) == 4) {
              uVar8 = 1;
              highsLogDev(*(HighsLogOptions **)(local_28 + 0x380),
                          *(HighsLogType *)(local_28 + 0x388),(char *)(local_20 + 0x380),1,
                          "HEkkPrimal:: Using dual simplex to try to clean up num / max / sum = %d / %g / %g primal infeasibilities\n"
                          ,(ulong)*(uint *)(local_28 + 0x378));
              HEkk::computePrimalObjectiveValue((HEkk *)CONCAT44(in_stack_ffffffffffffd3d4,uVar8));
              HighsSimplexAnalysis::simplexTimerStart
                        (in_stack_ffffffffffffd3c0,in_stack_ffffffffffffd3bc,
                         in_stack_ffffffffffffd3b8);
              uVar1 = *(undefined8 *)(local_28 + 0x2b8);
              *(undefined8 *)(local_28 + 0x2b8) = 0;
              uVar8 = *(undefined4 *)(local_28 + 0x2a8);
              *(undefined4 *)(local_28 + 0x2a8) = 1;
              HEkkDual::HEkkDual(in_stack_ffffffffffffd520,in_stack_ffffffffffffd518);
              HEkkDual::solve(in_stack_ffffffffffffdba8,(bool)in_stack_ffffffffffffdba7);
              *(undefined8 *)(local_28 + 0x2b8) = uVar1;
              *(undefined4 *)(local_28 + 0x2a8) = uVar8;
              HighsSimplexAnalysis::simplexTimerStop
                        (in_stack_ffffffffffffd3c0,in_stack_ffffffffffffd3bc,
                         in_stack_ffffffffffffd3b8);
              HighsLogOptions::HighsLogOptions
                        ((HighsLogOptions *)
                         CONCAT44(in_stack_ffffffffffffd3b4,in_stack_ffffffffffffd3b0),
                         in_stack_ffffffffffffd3a8);
              paVar7 = (allocator *)&stack0xffffffffffffd3f7;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&stack0xffffffffffffd3f8,"HEkkDual::solve",paVar7);
              HVar6 = interpretCallStatus((HighsLogOptions *)
                                          CONCAT44(in_stack_ffffffffffffd404,
                                                   in_stack_ffffffffffffd400),
                                          in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8,
                                          (string *)
                                          CONCAT44(in_stack_ffffffffffffd3f4,
                                                   in_stack_ffffffffffffd3f0));
              std::__cxx11::string::~string((string *)&stack0xffffffffffffd3f8);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffd3f7);
              HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x7a656a);
              *(undefined1 *)(*in_RDI + 0x3709) = 0;
              if (HVar6 == kOk) {
                if ((*(int *)(*in_RDI + 0x2970) == 7) &&
                   (*(int *)(local_28 + 0x378) + *(int *)(local_28 + 0x390) != 0)) {
                  highsLogDev(*(HighsLogOptions **)(local_28 + 0x380),
                              *(HighsLogType *)(local_28 + 0x398),(char *)(local_20 + 0x380),4,
                              "HEkkPrimal:: Dual simplex clean up yields  optimality, but with %d (max %g) primal infeasibilities and d (max %g) dual infeasibilities\n"
                              ,(ulong)*(uint *)(local_28 + 0x378),(ulong)*(uint *)(local_28 + 0x390)
                             );
                }
                iVar9 = 0;
              }
              else {
                local_4 = HEkk::returnFromSolve
                                    ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,
                                                      in_stack_ffffffffffffd408),
                                     in_stack_ffffffffffffd404);
                iVar9 = 1;
              }
              HEkkDual::~HEkkDual((HEkkDual *)in_stack_ffffffffffffd420);
              if (iVar9 != 0) {
                return local_4;
              }
              in_stack_ffffffffffffd3f0 = 0;
            }
            HVar5 = HEkk::debugOkForSolve
                              ((HEkk *)CONCAT44(in_stack_ffffffffffffd3fc,in_stack_ffffffffffffd3f8)
                               ,in_stack_ffffffffffffd3f4,in_stack_ffffffffffffd3f0);
            if (HVar5 == kLogicalError) {
              local_4 = HEkk::returnFromSolve
                                  ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,
                                                    in_stack_ffffffffffffd408),
                                   in_stack_ffffffffffffd404);
            }
            else {
              local_4 = HEkk::returnFromSolve
                                  ((HEkk *)CONCAT17(in_stack_ffffffffffffd40f,
                                                    in_stack_ffffffffffffd408),
                                   in_stack_ffffffffffffd404);
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

HighsStatus HEkkPrimal::solve(const bool pass_force_phase2) {
  // Initialise control data for a particular solve
  initialiseSolve();
  // Assumes that the LP has a positive number of rows
  if (ekk_instance_.isUnconstrainedLp())
    return ekk_instance_.returnFromSolve(HighsStatus::kError);

  HighsOptions& options = *ekk_instance_.options_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexStatus& status = ekk_instance_.status_;

  if (!status.has_invert) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "HEkkPrimal::solve called without INVERT\n");
    assert(status.has_fresh_invert);
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  }

  if (debugPrimalSimplex("Initialise", true) == HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);

  // Get the nonbasic free column set
  getNonbasicFreeColumnSet();

  const bool primal_feasible_with_unperturbed_bounds =
      info.num_primal_infeasibilities == 0;
  const bool force_phase2 =
      pass_force_phase2 ||
      info.max_primal_infeasibility * info.max_primal_infeasibility <
          options.primal_feasibility_tolerance;
  // Determine whether the solution is near-optimal. Values 1000 and
  // 1e-3 (ensuring sum<1) are unimportant, as the sum of dual
  // infeasibilities for near-optimal solutions is typically many
  // orders of magnitude smaller than 1, and the sum of dual
  // infeasibilities will be very much larger for non-trivial LPs
  // that are primal feasible for a logical or crash basis.
  //
  // Consider there to be no primal infeasibilities if there are none,
  // or if phase 2 is forced, in which case any primal infeasibilities
  // will be shifted
  const bool no_simplex_primal_infeasibilities =
      primal_feasible_with_unperturbed_bounds || force_phase2;
  const bool near_optimal = info.num_dual_infeasibilities < 1000 &&
                            info.max_dual_infeasibility < 1e-3 &&
                            no_simplex_primal_infeasibilities;
  // For reporting, save primal infeasibility data for the LP without
  // bound perturbations
  const HighsInt unperturbed_num_infeasibilities =
      info.num_primal_infeasibilities;
  const double unperturbed_max_infeasibility = info.max_primal_infeasibility;
  const double unperturbed_sum_infeasibilities =
      info.sum_primal_infeasibilities;
  if (near_optimal)
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "Primal feasible and num / max / sum "
                "dual infeasibilities of "
                "%" HIGHSINT_FORMAT
                " / %g "
                "/ %g, so near-optimal\n",
                info.num_dual_infeasibilities, info.max_dual_infeasibility,
                info.sum_dual_infeasibilities);

  // Perturb bounds according to whether the solution is near-optimal
  const bool perturb_bounds = !near_optimal;
  if (!perturb_bounds)
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "Near-optimal, so don't use bound perturbation\n");
  if (perturb_bounds && info.primal_simplex_bound_perturbation_multiplier) {
    ekk_instance_.initialiseBound(SimplexAlgorithm::kPrimal, kSolvePhaseUnknown,
                                  perturb_bounds);
    ekk_instance_.initialiseNonbasicValueAndMove();
    ekk_instance_.computePrimal();
    ekk_instance_.computeSimplexPrimalInfeasible();
  }

  // Check whether the time/iteration limit has been reached. First
  // point at which a non-error return can occur
  if (ekk_instance_.bailout())
    return ekk_instance_.returnFromSolve(HighsStatus::kWarning);

  // Now to do some iterations!
  HighsInt num_primal_infeasibility =
      ekk_instance_.info_.num_primal_infeasibilities;
  solve_phase = num_primal_infeasibility > 0 ? kSolvePhase1 : kSolvePhase2;
  if (force_phase2) {
    // Dual infeasibilities without cost perturbation involved
    // fixed variables or were (at most) small, so can easily be
    // removed by flips for and fixed variables shifts for the rest
    solve_phase = kSolvePhase2;
    if (!pass_force_phase2) {
      const bool local_report = false;  // true;
      if (!primal_feasible_with_unperturbed_bounds && local_report) {
        printf(
            "Solve %d: Forcing phase 2 since near primal feasible with "
            "unperturbed "
            "costs\n"
            "num / max / sum primal infeasibilities\n"
            "%d / %11.4g / %11.4g (  perturbed bounds)\n"
            "%d / %11.4g / %11.4g (unperturbed bounds)\n",
            (int)ekk_instance_.debug_solve_call_num_,
            (int)info.num_primal_infeasibilities, info.max_primal_infeasibility,
            info.sum_primal_infeasibilities,
            (int)unperturbed_num_infeasibilities, unperturbed_max_infeasibility,
            unperturbed_sum_infeasibilities);
      }
    }
  }
  if (ekk_instance_.debugOkForSolve(algorithm, solve_phase) ==
      HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  // Resize the copy of scattered edge weights for backtracking
  info.backtracking_basis_edge_weight_.resize(num_tot);

  // The major solving loop
  //
  // Possibly write out the column header for iteration reports, and
  // initialise records for primal correction reporting
  localReportIter(true);
  correctPrimal(true);
  while (solve_phase) {
    HighsInt it0 = ekk_instance_.iteration_count_;
    // When starting a new phase the (updated) primal objective function
    // value isn't known. Indicate this so that when the value
    // computed from scratch in rebuild() isn't checked against the
    // updated value
    status.has_primal_objective_value = false;
    if (solve_phase == kSolvePhaseUnknown) {
      // Determine the number of primal infeasibilities, and hence the solve
      // phase
      ekk_instance_.computeSimplexPrimalInfeasible();
      num_primal_infeasibility = ekk_instance_.info_.num_primal_infeasibilities;
      solve_phase = num_primal_infeasibility > 0 ? kSolvePhase1 : kSolvePhase2;
      if (info.backtracking_) {
        // Backtracking
        ekk_instance_.initialiseCost(SimplexAlgorithm::kPrimal, solve_phase);
        ekk_instance_.initialiseNonbasicValueAndMove();
        // Can now forget that we might have been backtracking
        info.backtracking_ = false;
      }
    }
    assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2);
    if (solve_phase == kSolvePhase1) {
      //
      // Phase 1
      //
      // solve_phase = kSolvePhase1 if the iteration or time limit has
      // been reached
      //
      // solve_phase = kSolvePhase2 if there are no primal infeasibilities
      //
      // solve_phase = kSolvePhaseUnknown if backtracking
      //
      // solve_phase = kSolvePhaseExit if primal infeasibility is
      // detected, in which case model_status_ =
      // HighsModelStatus::kInfeasible is set
      //
      // solve_phase = kSolvePhaseTabooBasis is set if only basis change is
      // taboo
      //
      // solve_phase = kSolvePhaseError is set if an error occurs
      solvePhase1();
      assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2 ||
             solve_phase == kSolvePhaseUnknown ||
             solve_phase == kSolvePhaseExit ||
             solve_phase == kSolvePhaseTabooBasis ||
             solve_phase == kSolvePhaseError);
      info.primal_phase1_iteration_count +=
          (ekk_instance_.iteration_count_ - it0);
    } else if (solve_phase == kSolvePhase2) {
      //
      // Phase 2
      //
      // solve_phase = kSolvePhaseOptimal if there are no dual
      // infeasibilities
      //
      // solve_phase = kSolvePhase1 if there are primal
      // infeasibilities
      //
      // solve_phase = kSolvePhase2 if the iteration or time limit has
      // been reached
      //
      // solve_phase = kSolvePhaseOptimalCleanup if, after removing bound
      // shifts, there are primal infeasibilities to clean up
      //
      // solve_phase = kSolvePhaseUnknown if backtracking
      //
      // solve_phase = kSolvePhaseExit if primal unboundedness is
      // detected, in which case model_status_ =
      // HighsModelStatus::kUnbounded is set
      //
      // solve_phase = kSolvePhaseTabooBasis is set if only basis change is
      // taboo
      //
      // solve_phase = kSolvePhaseError is set if an error occurs
      solvePhase2();
      assert(solve_phase == kSolvePhaseOptimal || solve_phase == kSolvePhase1 ||
             solve_phase == kSolvePhase2 ||
             solve_phase == kSolvePhaseOptimalCleanup ||
             solve_phase == kSolvePhaseUnknown ||
             solve_phase == kSolvePhaseExit ||
             solve_phase == kSolvePhaseTabooBasis ||
             solve_phase == kSolvePhaseError);
      assert(solve_phase != kSolvePhaseExit ||
             ekk_instance_.model_status_ == HighsModelStatus::kUnbounded);
      info.primal_phase2_iteration_count +=
          (ekk_instance_.iteration_count_ - it0);
    } else {
      // Should only be kSolvePhase1 or kSolvePhase2
      ekk_instance_.model_status_ = HighsModelStatus::kSolveError;
      return ekk_instance_.returnFromSolve(HighsStatus::kError);
    }
    // Return if bailing out from solve
    if (ekk_instance_.solve_bailout_)
      return ekk_instance_.returnFromSolve(HighsStatus::kWarning);
    // Can have all possible cases of solve_phase
    assert(solve_phase >= kSolvePhaseMin && solve_phase <= kSolvePhaseMax);
    // Look for scenarios when the major solving loop ends
    if (solve_phase == kSolvePhaseTabooBasis) {
      // Only basis change is taboo so return HighsStatus::kWarning
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "HEkkPrimal::solve Only basis change is taboo\n");
      ekk_instance_.model_status_ = HighsModelStatus::kUnknown;
      return ekk_instance_.returnFromSolve(HighsStatus::kWarning);
    }
    if (solve_phase == kSolvePhaseError) {
      // Solver error so return HighsStatus::kError
      ekk_instance_.model_status_ = HighsModelStatus::kSolveError;
      return ekk_instance_.returnFromSolve(HighsStatus::kError);
    }
    if (solve_phase == kSolvePhaseExit) {
      // LP identified as not having an optimal solution
      assert(ekk_instance_.model_status_ == HighsModelStatus::kInfeasible ||
             ekk_instance_.model_status_ == HighsModelStatus::kUnbounded);
      // If infeasible, save the primal phase 1 dual values before
      // they are overwritten with the duals for the original
      // objective
      if (ekk_instance_.model_status_ == HighsModelStatus::kInfeasible)
        ekk_instance_.primal_phase1_dual_ = ekk_instance_.info_.workDual_;
      break;
    }
    if (solve_phase == kSolvePhaseOptimalCleanup) {
      // Primal infeasibilities after phase 2. Dual feasible with
      // primal infeasibilities so use dual simplex to clean up
      break;
    }
    // If solve_phase == kSolvePhaseOptimal == 0 then major solving
    // loop ends naturally since solve_phase is false
  }
  // If bailing out, should have returned already
  assert(!ekk_instance_.solve_bailout_);
  // Should only have these cases
  assert(solve_phase ==
             kSolvePhaseExit ||  // solve_phase == kSolvePhaseUnknown ||
         solve_phase == kSolvePhaseOptimal ||  // solve_phase == kSolvePhase1 ||
         solve_phase == kSolvePhaseOptimalCleanup);
  if (solve_phase == kSolvePhaseOptimal)
    ekk_instance_.model_status_ = HighsModelStatus::kOptimal;

  if (solve_phase == kSolvePhaseOptimalCleanup) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "HEkkPrimal:: Using dual simplex to try to clean up num / "
                "max / sum = %" HIGHSINT_FORMAT
                " / %g / %g primal infeasibilities\n",
                info.num_primal_infeasibilities, info.max_primal_infeasibility,
                info.sum_primal_infeasibilities);
    ekk_instance_.computePrimalObjectiveValue();
    // Use dual to clean up. This almost always yields optimality,
    // and shouldn't yield infeasibility - since the current point
    // is dual feasible - but can yield
    // unboundedness. Time/iteration limit return is, of course,
    // possible, as are solver error
    HighsStatus return_status = HighsStatus::kOk;
    analysis->simplexTimerStart(SimplexDualPhase2Clock);
    // Switch off any bound perturbation
    double save_dual_simplex_cost_perturbation_multiplier =
        info.dual_simplex_cost_perturbation_multiplier;
    info.dual_simplex_cost_perturbation_multiplier = 0;
    HighsInt simplex_strategy = info.simplex_strategy;
    info.simplex_strategy = kSimplexStrategyDualPlain;
    HEkkDual dual_solver(ekk_instance_);
    HighsStatus call_status = dual_solver.solve(true);
    // Restore any bound perturbation
    info.dual_simplex_cost_perturbation_multiplier =
        save_dual_simplex_cost_perturbation_multiplier;
    info.simplex_strategy = simplex_strategy;
    analysis->simplexTimerStop(SimplexDualPhase2Clock);
    assert(ekk_instance_.called_return_from_solve_);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "HEkkDual::solve");
    // Reset called_return_from_solve_ to be false, since it's
    // called for this solve
    ekk_instance_.called_return_from_solve_ = false;
    if (return_status != HighsStatus::kOk)
      return ekk_instance_.returnFromSolve(return_status);
    if (ekk_instance_.model_status_ == HighsModelStatus::kOptimal &&
        info.num_primal_infeasibilities + info.num_dual_infeasibilities)
      highsLogDev(options.log_options, HighsLogType::kWarning,
                  "HEkkPrimal:: Dual simplex clean up yields  optimality, but "
                  "with %" HIGHSINT_FORMAT
                  " (max %g) primal infeasibilities and " HIGHSINT_FORMAT
                  " (max %g) dual infeasibilities\n",
                  info.num_primal_infeasibilities,
                  info.max_primal_infeasibility, info.num_dual_infeasibilities,
                  info.max_dual_infeasibility);
  }
  if (ekk_instance_.debugOkForSolve(algorithm, solve_phase) ==
      HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  return ekk_instance_.returnFromSolve(HighsStatus::kOk);
}